

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O0

uint8 * google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray
                  (UnknownFieldSet *unknown_fields,uint8 *target)

{
  int iVar1;
  Type TVar2;
  uint32 value;
  UnknownField *this;
  uint64 uVar3;
  string *value_00;
  uint8 *puVar4;
  UnknownFieldSet *unknown_fields_00;
  UnknownField *field;
  uint8 *puStack_18;
  int i;
  uint8 *target_local;
  UnknownFieldSet *unknown_fields_local;
  
  puStack_18 = target;
  for (field._4_4_ = 0; iVar1 = UnknownFieldSet::field_count(unknown_fields), field._4_4_ < iVar1;
      field._4_4_ = field._4_4_ + 1) {
    this = UnknownFieldSet::field(unknown_fields,field._4_4_);
    TVar2 = UnknownField::type(this);
    switch(TVar2) {
    case TYPE_VARINT:
      iVar1 = UnknownField::number(this);
      uVar3 = UnknownField::varint(this);
      puStack_18 = WireFormatLite::WriteInt64ToArray(iVar1,uVar3,puStack_18);
      break;
    case TYPE_FIXED32:
      iVar1 = UnknownField::number(this);
      value = UnknownField::fixed32(this);
      puStack_18 = WireFormatLite::WriteFixed32ToArray(iVar1,value,puStack_18);
      break;
    case TYPE_FIXED64:
      iVar1 = UnknownField::number(this);
      uVar3 = UnknownField::fixed64(this);
      puStack_18 = WireFormatLite::WriteFixed64ToArray(iVar1,uVar3,puStack_18);
      break;
    case TYPE_LENGTH_DELIMITED:
      iVar1 = UnknownField::number(this);
      value_00 = UnknownField::length_delimited_abi_cxx11_(this);
      puStack_18 = WireFormatLite::WriteBytesToArray(iVar1,value_00,puStack_18);
      break;
    case TYPE_GROUP:
      iVar1 = UnknownField::number(this);
      puVar4 = WireFormatLite::WriteTagToArray(iVar1,WIRETYPE_START_GROUP,puStack_18);
      unknown_fields_00 = UnknownField::group(this);
      puVar4 = SerializeUnknownFieldsToArray(unknown_fields_00,puVar4);
      iVar1 = UnknownField::number(this);
      puStack_18 = WireFormatLite::WriteTagToArray(iVar1,WIRETYPE_END_GROUP,puVar4);
    }
  }
  return puStack_18;
}

Assistant:

uint8* WireFormat::SerializeUnknownFieldsToArray(
    const UnknownFieldSet& unknown_fields,
    uint8* target) {
  for (int i = 0; i < unknown_fields.field_count(); i++) {
    const UnknownField& field = unknown_fields.field(i);

    switch (field.type()) {
      case UnknownField::TYPE_VARINT:
        target = WireFormatLite::WriteInt64ToArray(
            field.number(), field.varint(), target);
        break;
      case UnknownField::TYPE_FIXED32:
        target = WireFormatLite::WriteFixed32ToArray(
            field.number(), field.fixed32(), target);
        break;
      case UnknownField::TYPE_FIXED64:
        target = WireFormatLite::WriteFixed64ToArray(
            field.number(), field.fixed64(), target);
        break;
      case UnknownField::TYPE_LENGTH_DELIMITED:
        target = WireFormatLite::WriteBytesToArray(
            field.number(), field.length_delimited(), target);
        break;
      case UnknownField::TYPE_GROUP:
        target = WireFormatLite::WriteTagToArray(
            field.number(), WireFormatLite::WIRETYPE_START_GROUP, target);
        target = SerializeUnknownFieldsToArray(field.group(), target);
        target = WireFormatLite::WriteTagToArray(
            field.number(), WireFormatLite::WIRETYPE_END_GROUP, target);
        break;
    }
  }
  return target;
}